

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O2

void __thiscall crnlib::qdxt5::clear(qdxt5 *this)

{
  long lVar1;
  
  this->m_main_thread_id = 0;
  *(undefined8 *)&this->m_num_blocks = 0;
  *(undefined8 *)((long)&this->m_pBlocks + 4) = 0;
  *(undefined8 *)((long)&this->m_pDst_elements + 4) = 0;
  qdxt5_params::clear(&this->m_params);
  clusterizer<crnlib::vec<2U,_float>_>::clear(&this->m_endpoint_clusterizer);
  vector<crnlib::vector<unsigned_int>_>::clear(&this->m_endpoint_cluster_indices);
  this->m_max_selector_clusters = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  threaded_clusterizer<crnlib::vec<16U,_float>_>::clear(&this->m_selector_clusterizer);
  for (lVar1 = 0; lVar1 != 0x1000; lVar1 = lVar1 + 0x10) {
    vector<crnlib::vector<unsigned_int>_>::clear
              ((vector<crnlib::vector<unsigned_int>_> *)
               ((long)&this->m_cached_selector_cluster_indices[0].m_p + lVar1));
  }
  hash_map<crnlib::qdxt5::cluster_id,_unsigned_int,_crnlib::hasher<crnlib::qdxt5::cluster_id>,_crnlib::equal_to<crnlib::qdxt5::cluster_id>_>
  ::clear(&this->m_cluster_hash);
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

void qdxt5::clear() {
  m_main_thread_id = 0;
  m_num_blocks = 0;
  m_pBlocks = 0;
  m_pDst_elements = NULL;
  m_elements_per_block = 0;
  m_params.clear();
  m_endpoint_clusterizer.clear();
  m_endpoint_cluster_indices.clear();
  m_max_selector_clusters = 0;
  m_canceled = false;
  m_progress_start = 0;
  m_progress_range = 100;
  m_selector_clusterizer.clear();

  for (uint i = 0; i <= qdxt5_params::cMaxQuality; i++)
    m_cached_selector_cluster_indices[i].clear();

  m_cluster_hash.clear();

  m_prev_percentage_complete = -1;
}